

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O3

Bounds3f * __thiscall
phyr::Transform::operator()(Bounds3f *__return_storage_ptr__,Transform *this,Bounds3f *b)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  double dVar4;
  double dVar7;
  undefined1 auVar5 [16];
  double dVar8;
  undefined1 auVar6 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  Point3<double> local_78;
  double local_60;
  double local_58;
  double local_50;
  double dStack_48;
  double local_40;
  double dStack_38;
  double local_30;
  double dStack_28;
  
  dVar8 = (b->pMin).x;
  dVar23 = (b->pMin).y;
  dVar7 = (b->pMin).z;
  dVar2 = (this->mat).d[0][0];
  dVar15 = (this->mat).d[2][0];
  local_60 = (this->mat).d[2][1] * dVar23;
  dVar20 = (this->mat).d[2][2] * dVar7;
  local_58 = (this->mat).d[2][3];
  dVar22 = (this->mat).d[3][0];
  dVar25 = (this->mat).d[3][1] * dVar23;
  dVar26 = (this->mat).d[3][2] * dVar7;
  dVar24 = (this->mat).d[3][3];
  dVar1 = dVar22 * dVar8 + dVar25 + dVar26 + dVar24;
  uVar3 = -(uint)(dVar1 == 1.0) & 1;
  dVar27 = dVar15 * dVar8 + local_60 + dVar20 + local_58;
  dVar28 = 1.0 / dVar1;
  dVar18 = dVar27 * dVar28;
  dVar14 = (this->mat).d[0][3];
  if ((dVar1 == 1.0) && (!NAN(dVar1))) {
    dVar18 = dVar27;
  }
  dVar1 = (this->mat).d[1][0];
  dVar21 = (this->mat).d[0][1] * dVar23;
  dVar23 = (this->mat).d[1][1] * dVar23;
  dVar4 = dVar7 * (this->mat).d[0][2];
  dVar7 = dVar7 * (this->mat).d[1][2];
  dVar27 = (this->mat).d[1][3];
  dVar17 = dVar8 * dVar2 + dVar21 + dVar4 + dVar14;
  dVar19 = dVar8 * dVar1 + dVar23 + dVar7 + dVar27;
  auVar16._0_8_ = CONCAT44((int)(uVar3 << 0x1f) >> 0x1f,(int)(uVar3 << 0x1f) >> 0x1f);
  auVar16._8_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar16._12_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  dVar8 = (double)(~auVar16._0_8_ & (ulong)(dVar28 * dVar17) | (ulong)dVar17 & auVar16._0_8_);
  dVar28 = (double)(~auVar16._8_8_ & (ulong)(dVar28 * dVar19) | (ulong)dVar19 & auVar16._8_8_);
  (__return_storage_ptr__->pMin).x = dVar8;
  (__return_storage_ptr__->pMin).y = dVar28;
  (__return_storage_ptr__->pMin).z = dVar18;
  (__return_storage_ptr__->pMax).x = dVar8;
  (__return_storage_ptr__->pMax).y = dVar28;
  (__return_storage_ptr__->pMax).z = dVar18;
  dVar8 = (b->pMax).x;
  dVar18 = local_58 + dVar20 + dVar15 * dVar8 + local_60;
  dVar24 = dVar24 + dVar26 + dVar22 * dVar8 + dVar25;
  uVar3 = -(uint)(dVar24 == 1.0) & 1;
  dVar15 = 1.0 / dVar24;
  local_78.z = dVar18 * dVar15;
  if ((dVar24 == 1.0) && (!NAN(dVar24))) {
    local_78.z = dVar18;
  }
  dVar14 = dVar14 + dVar4 + dVar2 * dVar8 + dVar21;
  dVar27 = dVar27 + dVar7 + dVar1 * dVar8 + dVar23;
  auVar5._0_8_ = CONCAT44((int)(uVar3 << 0x1f) >> 0x1f,(int)(uVar3 << 0x1f) >> 0x1f);
  auVar5._8_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar5._12_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  local_78.x = (double)(~auVar5._0_8_ & (ulong)(dVar15 * dVar14) | (ulong)dVar14 & auVar5._0_8_);
  local_78.y = (double)(~auVar5._8_8_ & (ulong)(dVar15 * dVar27) | (ulong)dVar27 & auVar5._8_8_);
  unionBounds<double>(__return_storage_ptr__,&local_78);
  (__return_storage_ptr__->pMax).y = local_30;
  (__return_storage_ptr__->pMax).z = dStack_28;
  (__return_storage_ptr__->pMin).z = local_40;
  (__return_storage_ptr__->pMax).x = dStack_38;
  (__return_storage_ptr__->pMin).x = local_50;
  (__return_storage_ptr__->pMin).y = dStack_48;
  dVar8 = (b->pMax).y;
  dVar23 = (b->pMin).x;
  dVar7 = (b->pMin).z;
  dVar24 = (this->mat).d[2][2] * dVar7 + (this->mat).d[2][0] * dVar23 + (this->mat).d[2][1] * dVar8
           + (this->mat).d[2][3];
  dVar15 = (this->mat).d[3][2] * dVar7 + (this->mat).d[3][0] * dVar23 + (this->mat).d[3][1] * dVar8
           + (this->mat).d[3][3];
  uVar3 = -(uint)(dVar15 == 1.0) & 1;
  dVar22 = 1.0 / dVar15;
  local_78.z = dVar24 * dVar22;
  if ((dVar15 == 1.0) && (!NAN(dVar15))) {
    local_78.z = dVar24;
  }
  dVar15 = (this->mat).d[0][3] +
           dVar7 * (this->mat).d[0][2] + dVar23 * (this->mat).d[0][0] + (this->mat).d[0][1] * dVar8;
  dVar8 = (this->mat).d[1][3] +
          dVar7 * (this->mat).d[1][2] + dVar23 * (this->mat).d[1][0] + (this->mat).d[1][1] * dVar8;
  auVar9._0_8_ = CONCAT44((int)(uVar3 << 0x1f) >> 0x1f,(int)(uVar3 << 0x1f) >> 0x1f);
  auVar9._8_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar9._12_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  local_78.x = (double)(~auVar9._0_8_ & (ulong)(dVar22 * dVar15) | (ulong)dVar15 & auVar9._0_8_);
  local_78.y = (double)(~auVar9._8_8_ & (ulong)(dVar22 * dVar8) | (ulong)dVar8 & auVar9._8_8_);
  unionBounds<double>(__return_storage_ptr__,&local_78);
  (__return_storage_ptr__->pMax).y = local_30;
  (__return_storage_ptr__->pMax).z = dStack_28;
  (__return_storage_ptr__->pMin).z = local_40;
  (__return_storage_ptr__->pMax).x = dStack_38;
  (__return_storage_ptr__->pMin).x = local_50;
  (__return_storage_ptr__->pMin).y = dStack_48;
  dVar8 = (b->pMin).x;
  dVar23 = (b->pMin).y;
  dVar7 = (b->pMax).z;
  dVar24 = (this->mat).d[2][2] * dVar7 + (this->mat).d[2][0] * dVar8 + (this->mat).d[2][1] * dVar23
           + (this->mat).d[2][3];
  dVar15 = (this->mat).d[3][2] * dVar7 + (this->mat).d[3][0] * dVar8 + (this->mat).d[3][1] * dVar23
           + (this->mat).d[3][3];
  uVar3 = -(uint)(dVar15 == 1.0) & 1;
  dVar22 = 1.0 / dVar15;
  local_78.z = dVar24 * dVar22;
  if ((dVar15 == 1.0) && (!NAN(dVar15))) {
    local_78.z = dVar24;
  }
  dVar15 = (this->mat).d[0][3] +
           dVar7 * (this->mat).d[0][2] + dVar8 * (this->mat).d[0][0] + (this->mat).d[0][1] * dVar23;
  dVar8 = (this->mat).d[1][3] +
          dVar7 * (this->mat).d[1][2] + dVar8 * (this->mat).d[1][0] + (this->mat).d[1][1] * dVar23;
  auVar10._0_8_ = CONCAT44((int)(uVar3 << 0x1f) >> 0x1f,(int)(uVar3 << 0x1f) >> 0x1f);
  auVar10._8_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar10._12_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  local_78.x = (double)(~auVar10._0_8_ & (ulong)(dVar22 * dVar15) | (ulong)dVar15 & auVar10._0_8_);
  local_78.y = (double)(~auVar10._8_8_ & (ulong)(dVar22 * dVar8) | (ulong)dVar8 & auVar10._8_8_);
  unionBounds<double>(__return_storage_ptr__,&local_78);
  (__return_storage_ptr__->pMax).y = local_30;
  (__return_storage_ptr__->pMax).z = dStack_28;
  (__return_storage_ptr__->pMin).z = local_40;
  (__return_storage_ptr__->pMax).x = dStack_38;
  (__return_storage_ptr__->pMin).x = local_50;
  (__return_storage_ptr__->pMin).y = dStack_48;
  dVar8 = (b->pMin).x;
  dVar23 = (b->pMax).y;
  dVar7 = (b->pMax).z;
  dVar24 = (this->mat).d[2][2] * dVar7 + (this->mat).d[2][0] * dVar8 + (this->mat).d[2][1] * dVar23
           + (this->mat).d[2][3];
  dVar15 = (this->mat).d[3][2] * dVar7 + (this->mat).d[3][0] * dVar8 + (this->mat).d[3][1] * dVar23
           + (this->mat).d[3][3];
  uVar3 = -(uint)(dVar15 == 1.0) & 1;
  dVar22 = 1.0 / dVar15;
  local_78.z = dVar24 * dVar22;
  if ((dVar15 == 1.0) && (!NAN(dVar15))) {
    local_78.z = dVar24;
  }
  dVar15 = (this->mat).d[0][3] +
           dVar7 * (this->mat).d[0][2] + dVar8 * (this->mat).d[0][0] + (this->mat).d[0][1] * dVar23;
  dVar8 = (this->mat).d[1][3] +
          dVar7 * (this->mat).d[1][2] + dVar8 * (this->mat).d[1][0] + (this->mat).d[1][1] * dVar23;
  auVar11._0_8_ = CONCAT44((int)(uVar3 << 0x1f) >> 0x1f,(int)(uVar3 << 0x1f) >> 0x1f);
  auVar11._8_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar11._12_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  local_78.x = (double)(~auVar11._0_8_ & (ulong)(dVar22 * dVar15) | (ulong)dVar15 & auVar11._0_8_);
  local_78.y = (double)(~auVar11._8_8_ & (ulong)(dVar22 * dVar8) | (ulong)dVar8 & auVar11._8_8_);
  unionBounds<double>(__return_storage_ptr__,&local_78);
  (__return_storage_ptr__->pMax).y = local_30;
  (__return_storage_ptr__->pMax).z = dStack_28;
  (__return_storage_ptr__->pMin).z = local_40;
  (__return_storage_ptr__->pMax).x = dStack_38;
  (__return_storage_ptr__->pMin).x = local_50;
  (__return_storage_ptr__->pMin).y = dStack_48;
  dVar8 = (b->pMin).z;
  dVar23 = (b->pMax).x;
  dVar7 = (b->pMax).y;
  dVar24 = (this->mat).d[2][2] * dVar8 + (this->mat).d[2][0] * dVar23 + (this->mat).d[2][1] * dVar7
           + (this->mat).d[2][3];
  dVar15 = (this->mat).d[3][2] * dVar8 + (this->mat).d[3][0] * dVar23 + (this->mat).d[3][1] * dVar7
           + (this->mat).d[3][3];
  uVar3 = -(uint)(dVar15 == 1.0) & 1;
  dVar22 = 1.0 / dVar15;
  local_78.z = dVar24 * dVar22;
  if ((dVar15 == 1.0) && (!NAN(dVar15))) {
    local_78.z = dVar24;
  }
  dVar15 = (this->mat).d[0][3] +
           dVar8 * (this->mat).d[0][2] + dVar23 * (this->mat).d[0][0] + (this->mat).d[0][1] * dVar7;
  dVar8 = (this->mat).d[1][3] +
          dVar8 * (this->mat).d[1][2] + dVar23 * (this->mat).d[1][0] + (this->mat).d[1][1] * dVar7;
  auVar12._0_8_ = CONCAT44((int)(uVar3 << 0x1f) >> 0x1f,(int)(uVar3 << 0x1f) >> 0x1f);
  auVar12._8_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar12._12_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  local_78.x = (double)(~auVar12._0_8_ & (ulong)(dVar22 * dVar15) | (ulong)dVar15 & auVar12._0_8_);
  local_78.y = (double)(~auVar12._8_8_ & (ulong)(dVar22 * dVar8) | (ulong)dVar8 & auVar12._8_8_);
  unionBounds<double>(__return_storage_ptr__,&local_78);
  (__return_storage_ptr__->pMax).y = local_30;
  (__return_storage_ptr__->pMax).z = dStack_28;
  (__return_storage_ptr__->pMin).z = local_40;
  (__return_storage_ptr__->pMax).x = dStack_38;
  (__return_storage_ptr__->pMin).x = local_50;
  (__return_storage_ptr__->pMin).y = dStack_48;
  dVar8 = (b->pMin).y;
  dVar23 = (b->pMax).x;
  dVar7 = (b->pMax).z;
  dVar24 = (this->mat).d[2][2] * dVar7 + (this->mat).d[2][0] * dVar23 + (this->mat).d[2][1] * dVar8
           + (this->mat).d[2][3];
  dVar15 = (this->mat).d[3][2] * dVar7 + (this->mat).d[3][0] * dVar23 + (this->mat).d[3][1] * dVar8
           + (this->mat).d[3][3];
  uVar3 = -(uint)(dVar15 == 1.0) & 1;
  dVar22 = 1.0 / dVar15;
  local_78.z = dVar24 * dVar22;
  if ((dVar15 == 1.0) && (!NAN(dVar15))) {
    local_78.z = dVar24;
  }
  dVar15 = (this->mat).d[0][3] +
           dVar7 * (this->mat).d[0][2] + dVar23 * (this->mat).d[0][0] + (this->mat).d[0][1] * dVar8;
  dVar8 = (this->mat).d[1][3] +
          dVar7 * (this->mat).d[1][2] + dVar23 * (this->mat).d[1][0] + (this->mat).d[1][1] * dVar8;
  auVar13._0_8_ = CONCAT44((int)(uVar3 << 0x1f) >> 0x1f,(int)(uVar3 << 0x1f) >> 0x1f);
  auVar13._8_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar13._12_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  local_78.x = (double)(~auVar13._0_8_ & (ulong)(dVar22 * dVar15) | (ulong)dVar15 & auVar13._0_8_);
  local_78.y = (double)(~auVar13._8_8_ & (ulong)(dVar22 * dVar8) | (ulong)dVar8 & auVar13._8_8_);
  unionBounds<double>(__return_storage_ptr__,&local_78);
  (__return_storage_ptr__->pMax).y = local_30;
  (__return_storage_ptr__->pMax).z = dStack_28;
  (__return_storage_ptr__->pMin).z = local_40;
  (__return_storage_ptr__->pMax).x = dStack_38;
  (__return_storage_ptr__->pMin).x = local_50;
  (__return_storage_ptr__->pMin).y = dStack_48;
  dVar8 = (b->pMax).x;
  dVar23 = (b->pMax).y;
  dVar7 = (b->pMax).z;
  dVar15 = (this->mat).d[2][2] * dVar7 + (this->mat).d[2][0] * dVar8 + (this->mat).d[2][1] * dVar23
           + (this->mat).d[2][3];
  dVar22 = (this->mat).d[3][2] * dVar7 + (this->mat).d[3][0] * dVar8 + (this->mat).d[3][1] * dVar23
           + (this->mat).d[3][3];
  uVar3 = -(uint)(dVar22 == 1.0) & 1;
  dVar24 = 1.0 / dVar22;
  local_78.z = dVar15 * dVar24;
  if ((dVar22 == 1.0) && (!NAN(dVar22))) {
    local_78.z = dVar15;
  }
  dVar15 = (this->mat).d[0][3] +
           dVar7 * (this->mat).d[0][2] + dVar8 * (this->mat).d[0][0] + (this->mat).d[0][1] * dVar23;
  dVar8 = (this->mat).d[1][3] +
          dVar7 * (this->mat).d[1][2] + dVar8 * (this->mat).d[1][0] + (this->mat).d[1][1] * dVar23;
  auVar6._0_8_ = CONCAT44((int)(uVar3 << 0x1f) >> 0x1f,(int)(uVar3 << 0x1f) >> 0x1f);
  auVar6._8_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar6._12_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  local_78.x = (double)(~auVar6._0_8_ & (ulong)(dVar24 * dVar15) | (ulong)dVar15 & auVar6._0_8_);
  local_78.y = (double)(~auVar6._8_8_ & (ulong)(dVar24 * dVar8) | (ulong)dVar8 & auVar6._8_8_);
  unionBounds<double>(__return_storage_ptr__,&local_78);
  (__return_storage_ptr__->pMax).y = local_30;
  (__return_storage_ptr__->pMax).z = dStack_28;
  (__return_storage_ptr__->pMin).z = local_40;
  (__return_storage_ptr__->pMax).x = dStack_38;
  (__return_storage_ptr__->pMin).x = local_50;
  (__return_storage_ptr__->pMin).y = dStack_48;
  return __return_storage_ptr__;
}

Assistant:

inline Bounds3f operator()(const Bounds3f& b) const {
        const Transform &M = *this;
        Bounds3f ret(M(Point3f(b.pMin.x, b.pMin.y, b.pMin.z)));
        ret = unionBounds(ret, M(Point3f(b.pMax.x, b.pMin.y, b.pMin.z)));
        ret = unionBounds(ret, M(Point3f(b.pMin.x, b.pMax.y, b.pMin.z)));
        ret = unionBounds(ret, M(Point3f(b.pMin.x, b.pMin.y, b.pMax.z)));
        ret = unionBounds(ret, M(Point3f(b.pMin.x, b.pMax.y, b.pMax.z)));
        ret = unionBounds(ret, M(Point3f(b.pMax.x, b.pMax.y, b.pMin.z)));
        ret = unionBounds(ret, M(Point3f(b.pMax.x, b.pMin.y, b.pMax.z)));
        ret = unionBounds(ret, M(Point3f(b.pMax.x, b.pMax.y, b.pMax.z)));
        return ret;
    }